

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

bool __thiscall
fmt::v10::detail::
for_each_codepoint<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/fmt/include/fmt/format-inl.h:1390:25)>
::anon_class_8_1_54a39806::anon_class_8_1_8991fb9c_for_f::operator()
          (anon_class_8_1_8991fb9c_for_f *this,uint32_t cp,string_view param_3)

{
  runtime_error *this_00;
  uint in_ESI;
  undefined8 *in_RDI;
  wchar_t *in_stack_ffffffffffffffb8;
  buffer<wchar_t> *this_01;
  
  this_01 = (buffer<wchar_t> *)*in_RDI;
  if (in_ESI == 0xffffffff) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"invalid utf8");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (in_ESI < 0x10000) {
    buffer<wchar_t>::push_back(this_01,in_stack_ffffffffffffffb8);
  }
  else {
    buffer<wchar_t>::push_back(this_01,in_stack_ffffffffffffffb8);
    buffer<wchar_t>::push_back(this_01,in_stack_ffffffffffffffb8);
  }
  return true;
}

Assistant:

FMT_FUNC detail::utf8_to_utf16::utf8_to_utf16(string_view s) {
  for_each_codepoint(s, [this](uint32_t cp, string_view) {
    if (cp == invalid_code_point) FMT_THROW(std::runtime_error("invalid utf8"));
    if (cp <= 0xFFFF) {
      buffer_.push_back(static_cast<wchar_t>(cp));
    } else {
      cp -= 0x10000;
      buffer_.push_back(static_cast<wchar_t>(0xD800 + (cp >> 10)));
      buffer_.push_back(static_cast<wchar_t>(0xDC00 + (cp & 0x3FF)));
    }
    return true;
  });
  buffer_.push_back(0);
}